

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O3

QRectF * __thiscall
QGraphicsLayoutItem::contentsRect(QRectF *__return_storage_ptr__,QGraphicsLayoutItem *this)

{
  QGraphicsLayoutItemPrivate *pQVar1;
  double dVar2;
  long in_FS_OFFSET;
  qreal bottom;
  qreal right;
  qreal top;
  qreal left;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = -NAN;
  local_48 = -NAN;
  local_50 = -NAN;
  local_58 = -NAN;
  (*this->_vptr_QGraphicsLayoutItem[3])(this,&local_40,&local_48,&local_50,&local_58);
  pQVar1 = (this->d_ptr).d;
  __return_storage_ptr__->xp = local_40 + 0.0;
  __return_storage_ptr__->yp = local_48 + 0.0;
  dVar2 = (pQVar1->geom).h;
  __return_storage_ptr__->w = ((pQVar1->geom).w - local_50) - local_40;
  __return_storage_ptr__->h = (dVar2 - local_58) - local_48;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsLayoutItem::contentsRect() const
{
    qreal left, top, right, bottom;
    getContentsMargins(&left, &top, &right, &bottom);
    return QRectF(QPointF(), geometry().size()).adjusted(+left, +top, -right, -bottom);
}